

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printing.h
# Opt level: O2

ostream * doIndent(ostream *o,uint indent)

{
  ostream *poVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct((ulong)local_38,(char)indent);
  poVar1 = std::operator<<(o,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return poVar1;
}

Assistant:

inline std::ostream& doIndent(std::ostream& o, unsigned indent) {
  return o << std::string(indent, ' ');
}